

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O1

void Assimp::SceneCombiner::MergeMeshes
               (aiMesh **_out,uint param_2,const_iterator begin,const_iterator end)

{
  uint uVar1;
  aiColor4D *__src;
  aiFace *paVar2;
  char *__src_00;
  aiVector3D **ppaVar3;
  ai_uint32 aVar4;
  aiMesh *paVar5;
  size_t sVar6;
  aiVector3D *paVar7;
  aiVector3D *paVar8;
  aiColor4D *__s;
  Logger *pLVar9;
  ulong *puVar10;
  aiFace *paVar11;
  int iVar12;
  aiFace *paVar13;
  const_iterator cVar14;
  const_iterator it;
  long lVar15;
  ulong uVar16;
  aiMesh *paVar17;
  ulong uVar18;
  string name;
  allocator local_89;
  char *local_88;
  undefined8 local_80;
  char local_78 [16];
  aiVector3D **local_68;
  aiVector3D **local_60;
  aiColor4D **local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (_out != (aiMesh **)0x0) {
    if (begin._M_current == end._M_current) {
      *_out = (aiMesh *)0x0;
    }
    else {
      paVar5 = (aiMesh *)operator_new(0x520);
      paVar5->mPrimitiveTypes = 0;
      paVar5->mNumVertices = 0;
      paVar5->mNumFaces = 0;
      local_68 = &paVar5->mVertices;
      local_60 = paVar5->mTextureCoords;
      memset(local_68,0,0xcc);
      paVar5->mBones = (aiBone **)0x0;
      paVar5->mMaterialIndex = 0;
      (paVar5->mName).length = 0;
      (paVar5->mName).data[0] = '\0';
      memset((paVar5->mName).data + 1,0x1b,0x3ff);
      paVar5->mNumAnimMeshes = 0;
      paVar5->mAnimMeshes = (aiAnimMesh **)0x0;
      paVar5->mMethod = 0;
      (paVar5->mAABB).mMin.x = 0.0;
      (paVar5->mAABB).mMin.y = 0.0;
      (paVar5->mAABB).mMin.z = 0.0;
      (paVar5->mAABB).mMax.x = 0.0;
      (paVar5->mAABB).mMax.y = 0.0;
      (paVar5->mAABB).mMax.z = 0.0;
      paVar5->mTextureCoords[0] = (aiVector3D *)0x0;
      paVar5->mTextureCoords[1] = (aiVector3D *)0x0;
      paVar5->mTextureCoords[2] = (aiVector3D *)0x0;
      paVar5->mTextureCoords[3] = (aiVector3D *)0x0;
      paVar5->mTextureCoords[4] = (aiVector3D *)0x0;
      paVar5->mTextureCoords[5] = (aiVector3D *)0x0;
      paVar5->mTextureCoords[6] = (aiVector3D *)0x0;
      paVar5->mTextureCoords[7] = (aiVector3D *)0x0;
      paVar5->mNumUVComponents[0] = 0;
      paVar5->mNumUVComponents[1] = 0;
      paVar5->mNumUVComponents[2] = 0;
      paVar5->mNumUVComponents[3] = 0;
      paVar5->mNumUVComponents[4] = 0;
      paVar5->mNumUVComponents[5] = 0;
      paVar5->mNumUVComponents[6] = 0;
      paVar5->mNumUVComponents[7] = 0;
      local_58 = paVar5->mColors;
      paVar5->mColors[0] = (aiColor4D *)0x0;
      paVar5->mColors[1] = (aiColor4D *)0x0;
      paVar5->mColors[2] = (aiColor4D *)0x0;
      paVar5->mColors[3] = (aiColor4D *)0x0;
      paVar5->mColors[4] = (aiColor4D *)0x0;
      paVar5->mColors[5] = (aiColor4D *)0x0;
      paVar5->mColors[6] = (aiColor4D *)0x0;
      paVar5->mColors[7] = (aiColor4D *)0x0;
      *_out = paVar5;
      paVar5->mMaterialIndex = (*begin._M_current)->mMaterialIndex;
      local_88 = local_78;
      local_80 = 0;
      local_78[0] = '\0';
      cVar14._M_current = begin._M_current;
      do {
        std::__cxx11::string::string
                  ((string *)local_50,((*cVar14._M_current)->mName).data,&local_89);
        std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_50[0]);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        if (cVar14._M_current != end._M_current + -1) {
          std::__cxx11::string::append((char *)&local_88);
        }
        __src_00 = local_88;
        paVar17 = *cVar14._M_current;
        paVar5->mNumVertices = paVar5->mNumVertices + paVar17->mNumVertices;
        paVar5->mNumFaces = paVar5->mNumFaces + paVar17->mNumFaces;
        paVar5->mNumBones = paVar5->mNumBones + paVar17->mNumBones;
        paVar5->mPrimitiveTypes = paVar5->mPrimitiveTypes | paVar17->mPrimitiveTypes;
        cVar14._M_current = cVar14._M_current + 1;
      } while (cVar14._M_current != end._M_current);
      sVar6 = strlen(local_88);
      aVar4 = (ai_uint32)sVar6;
      if ((int)aVar4 < 0x400) {
        (paVar5->mName).length = aVar4;
        memcpy((paVar5->mName).data,__src_00,(long)(int)aVar4);
        (paVar5->mName).data[(int)aVar4] = '\0';
      }
      uVar1 = paVar5->mNumVertices;
      if (uVar1 != 0) {
        if (((*begin._M_current)->mVertices != (aiVector3D *)0x0) &&
           ((*begin._M_current)->mNumVertices != 0)) {
          paVar7 = (aiVector3D *)operator_new__((ulong)uVar1 * 0xc);
          memset(paVar7,0,(((ulong)uVar1 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          *local_68 = paVar7;
          cVar14._M_current = begin._M_current;
          if (begin._M_current != end._M_current) {
            do {
              paVar8 = (*cVar14._M_current)->mVertices;
              if (paVar8 == (aiVector3D *)0x0) {
                pLVar9 = DefaultLogger::get();
                Logger::warn(pLVar9,
                             "JoinMeshes: Positions expected but input mesh contains no positions");
              }
              else {
                memcpy(paVar7,paVar8,(ulong)(*cVar14._M_current)->mNumVertices * 0xc);
              }
              paVar7 = paVar7 + (*cVar14._M_current)->mNumVertices;
              cVar14._M_current = cVar14._M_current + 1;
            } while (cVar14._M_current != end._M_current);
          }
        }
        if (((*begin._M_current)->mNormals != (aiVector3D *)0x0) &&
           ((*begin._M_current)->mNumVertices != 0)) {
          uVar16 = (ulong)paVar5->mNumVertices;
          paVar7 = (aiVector3D *)operator_new__(uVar16 * 0xc);
          if (uVar16 != 0) {
            memset(paVar7,0,((uVar16 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar5->mNormals = paVar7;
          cVar14._M_current = begin._M_current;
          if (begin._M_current != end._M_current) {
            do {
              paVar8 = (*cVar14._M_current)->mNormals;
              if (paVar8 == (aiVector3D *)0x0) {
                pLVar9 = DefaultLogger::get();
                Logger::warn(pLVar9,
                             "JoinMeshes: Normals expected but input mesh contains no normals");
              }
              else {
                memcpy(paVar7,paVar8,(ulong)(*cVar14._M_current)->mNumVertices * 0xc);
              }
              paVar7 = paVar7 + (*cVar14._M_current)->mNumVertices;
              cVar14._M_current = cVar14._M_current + 1;
            } while (cVar14._M_current != end._M_current);
          }
        }
        paVar17 = *begin._M_current;
        if (((paVar17->mTangents != (aiVector3D *)0x0) &&
            (paVar17->mBitangents != (aiVector3D *)0x0)) && (paVar17->mNumVertices != 0)) {
          uVar1 = paVar5->mNumVertices;
          uVar16 = (ulong)uVar1;
          paVar7 = (aiVector3D *)operator_new__(uVar16 * 0xc);
          if (uVar16 != 0) {
            memset(paVar7,0,((uVar16 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar5->mTangents = paVar7;
          paVar8 = (aiVector3D *)operator_new__(uVar16 * 0xc);
          if (uVar1 != 0) {
            memset(paVar8,0,((uVar16 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar5->mBitangents = paVar8;
          cVar14._M_current = begin._M_current;
          if (begin._M_current != end._M_current) {
            do {
              paVar17 = *cVar14._M_current;
              if (paVar17->mTangents == (aiVector3D *)0x0) {
                pLVar9 = DefaultLogger::get();
                Logger::warn(pLVar9,
                             "JoinMeshes: Tangents expected but input mesh contains no tangents");
              }
              else {
                memcpy(paVar7,paVar17->mTangents,(ulong)paVar17->mNumVertices * 0xc);
                memcpy(paVar8,paVar17->mBitangents,(ulong)paVar17->mNumVertices * 0xc);
              }
              paVar7 = paVar7 + (*cVar14._M_current)->mNumVertices;
              paVar8 = paVar8 + (*cVar14._M_current)->mNumVertices;
              cVar14._M_current = cVar14._M_current + 1;
            } while (cVar14._M_current != end._M_current);
          }
        }
        ppaVar3 = local_60;
        lVar15 = 0;
        do {
          paVar17 = *begin._M_current;
          if ((paVar17->mTextureCoords[lVar15] == (aiVector3D *)0x0) || (paVar17->mNumVertices == 0)
             ) break;
          paVar5->mNumUVComponents[lVar15] = paVar17->mNumUVComponents[lVar15];
          uVar16 = (ulong)paVar5->mNumVertices;
          paVar7 = (aiVector3D *)operator_new__(uVar16 * 0xc);
          if (uVar16 != 0) {
            memset(paVar7,0,((uVar16 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          ppaVar3[lVar15] = paVar7;
          cVar14._M_current = begin._M_current;
          if (begin._M_current != end._M_current) {
            do {
              paVar8 = (*cVar14._M_current)->mTextureCoords[lVar15];
              if (paVar8 == (aiVector3D *)0x0) {
                pLVar9 = DefaultLogger::get();
                Logger::warn(pLVar9,"JoinMeshes: UVs expected but input mesh contains no UVs");
              }
              else {
                memcpy(paVar7,paVar8,(ulong)(*cVar14._M_current)->mNumVertices * 0xc);
              }
              paVar7 = paVar7 + (*cVar14._M_current)->mNumVertices;
              cVar14._M_current = cVar14._M_current + 1;
            } while (cVar14._M_current != end._M_current);
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 8);
        lVar15 = 0;
        do {
          if (((*begin._M_current)->mColors[lVar15] == (aiColor4D *)0x0) ||
             ((*begin._M_current)->mNumVertices == 0)) break;
          uVar1 = paVar5->mNumVertices;
          uVar16 = (ulong)uVar1 << 4;
          __s = (aiColor4D *)operator_new__(uVar16);
          if ((ulong)uVar1 != 0) {
            memset(__s,0,uVar16);
          }
          local_58[lVar15] = __s;
          cVar14._M_current = begin._M_current;
          if (begin._M_current != end._M_current) {
            do {
              __src = (*cVar14._M_current)->mColors[lVar15];
              if (__src == (aiColor4D *)0x0) {
                pLVar9 = DefaultLogger::get();
                Logger::warn(pLVar9,"JoinMeshes: VCs expected but input mesh contains no VCs");
              }
              else {
                memcpy(__s,__src,(ulong)(*cVar14._M_current)->mNumVertices << 4);
              }
              __s = __s + (*cVar14._M_current)->mNumVertices;
              cVar14._M_current = cVar14._M_current + 1;
            } while (cVar14._M_current != end._M_current);
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 8);
      }
      uVar16 = (ulong)paVar5->mNumFaces;
      if (uVar16 != 0) {
        puVar10 = (ulong *)operator_new__(uVar16 * 0x10 + 8);
        *puVar10 = uVar16;
        paVar11 = (aiFace *)(puVar10 + 1);
        paVar13 = paVar11;
        do {
          paVar13->mNumIndices = 0;
          paVar13->mIndices = (uint *)0x0;
          paVar13 = paVar13 + 1;
        } while (paVar13 != (aiFace *)(puVar10 + uVar16 * 2 + 1));
        paVar5->mFaces = paVar11;
        if (begin._M_current != end._M_current) {
          iVar12 = 0;
          cVar14._M_current = begin._M_current;
          do {
            paVar17 = *cVar14._M_current;
            if (paVar17->mNumFaces != 0) {
              uVar16 = 0;
              do {
                paVar2 = paVar17->mFaces;
                paVar13 = paVar2 + uVar16;
                paVar11->mNumIndices = paVar2[uVar16].mNumIndices;
                paVar11->mIndices = paVar2[uVar16].mIndices;
                if ((iVar12 != 0) && (paVar13->mNumIndices != 0)) {
                  uVar18 = 0;
                  do {
                    paVar13->mIndices[uVar18] = paVar13->mIndices[uVar18] + iVar12;
                    uVar18 = uVar18 + 1;
                  } while (uVar18 < paVar13->mNumIndices);
                }
                paVar13->mIndices = (uint *)0x0;
                uVar16 = uVar16 + 1;
                paVar11 = paVar11 + 1;
                paVar17 = *cVar14._M_current;
              } while (uVar16 < paVar17->mNumFaces);
            }
            iVar12 = iVar12 + paVar17->mNumVertices;
            cVar14._M_current = cVar14._M_current + 1;
          } while (cVar14._M_current != end._M_current);
        }
      }
      if (paVar5->mNumBones != 0) {
        MergeBones(paVar5,begin,end);
      }
      if (begin._M_current != end._M_current) {
        do {
          paVar5 = *begin._M_current;
          if (paVar5 != (aiMesh *)0x0) {
            aiMesh::~aiMesh(paVar5);
            operator_delete(paVar5);
          }
          begin._M_current = begin._M_current + 1;
        } while (begin._M_current != end._M_current);
      }
      if (local_88 != local_78) {
        operator_delete(local_88);
      }
    }
  }
  return;
}

Assistant:

void SceneCombiner::MergeMeshes(aiMesh** _out, unsigned int /*flags*/,
    std::vector<aiMesh*>::const_iterator begin,
    std::vector<aiMesh*>::const_iterator end)
{
    if ( nullptr == _out ) {
        return;
    }

    if (begin == end)   {
        *_out = NULL; // no meshes ...
        return;
    }

    // Allocate the output mesh
    aiMesh* out = *_out = new aiMesh();
    out->mMaterialIndex = (*begin)->mMaterialIndex;

    std::string name;
    // Find out how much output storage we'll need
    for (std::vector<aiMesh*>::const_iterator it = begin; it != end; ++it) {
        const char *meshName( (*it)->mName.C_Str() );
        name += std::string( meshName );
        if ( it != end - 1 ) {
            name += ".";
        }
        out->mNumVertices   += (*it)->mNumVertices;
        out->mNumFaces      += (*it)->mNumFaces;
        out->mNumBones      += (*it)->mNumBones;

        // combine primitive type flags
        out->mPrimitiveTypes |= (*it)->mPrimitiveTypes;
    }
    out->mName.Set( name.c_str() );

    if (out->mNumVertices) {
        aiVector3D* pv2;

        // copy vertex positions
        if ((**begin).HasPositions())   {

            pv2 = out->mVertices = new aiVector3D[out->mNumVertices];
            for (std::vector<aiMesh*>::const_iterator it = begin; it != end; ++it)  {
                if ((*it)->mVertices)   {
                    ::memcpy(pv2,(*it)->mVertices,(*it)->mNumVertices*sizeof(aiVector3D));
                }
                else ASSIMP_LOG_WARN("JoinMeshes: Positions expected but input mesh contains no positions");
                pv2 += (*it)->mNumVertices;
            }
        }
        // copy normals
        if ((**begin).HasNormals()) {

            pv2 = out->mNormals = new aiVector3D[out->mNumVertices];
            for (std::vector<aiMesh*>::const_iterator it = begin; it != end;++it)   {
                if ((*it)->mNormals)    {
                    ::memcpy(pv2,(*it)->mNormals,(*it)->mNumVertices*sizeof(aiVector3D));
                } else {
                    ASSIMP_LOG_WARN( "JoinMeshes: Normals expected but input mesh contains no normals" );
                }
                pv2 += (*it)->mNumVertices;
            }
        }
        // copy tangents and bi-tangents
        if ((**begin).HasTangentsAndBitangents())   {

            pv2 = out->mTangents = new aiVector3D[out->mNumVertices];
            aiVector3D* pv2b = out->mBitangents = new aiVector3D[out->mNumVertices];

            for (std::vector<aiMesh*>::const_iterator it = begin; it != end;++it) {
                if ((*it)->mTangents)   {
                    ::memcpy(pv2, (*it)->mTangents,  (*it)->mNumVertices*sizeof(aiVector3D));
                    ::memcpy(pv2b,(*it)->mBitangents,(*it)->mNumVertices*sizeof(aiVector3D));
                } else {
                    ASSIMP_LOG_WARN( "JoinMeshes: Tangents expected but input mesh contains no tangents" );
                }
                pv2  += (*it)->mNumVertices;
                pv2b += (*it)->mNumVertices;
            }
        }
        // copy texture coordinates
        unsigned int n = 0;
        while ((**begin).HasTextureCoords(n)) {
            out->mNumUVComponents[n] = (*begin)->mNumUVComponents[n];

            pv2 = out->mTextureCoords[n] = new aiVector3D[out->mNumVertices];
            for (std::vector<aiMesh*>::const_iterator it = begin; it != end;++it)   {
                if ((*it)->mTextureCoords[n])   {
                    ::memcpy(pv2,(*it)->mTextureCoords[n],(*it)->mNumVertices*sizeof(aiVector3D));
                } else {
                    ASSIMP_LOG_WARN( "JoinMeshes: UVs expected but input mesh contains no UVs" );
                }
                pv2 += (*it)->mNumVertices;
            }
            ++n;
        }
        // copy vertex colors
        n = 0;
        while ((**begin).HasVertexColors(n))    {
            aiColor4D *pVec2 = out->mColors[n] = new aiColor4D[out->mNumVertices];
            for ( std::vector<aiMesh*>::const_iterator it = begin; it != end; ++it )   {
                if ((*it)->mColors[n])  {
                    ::memcpy( pVec2, (*it)->mColors[ n ], (*it)->mNumVertices * sizeof( aiColor4D ) ) ;
                } else {
                    ASSIMP_LOG_WARN( "JoinMeshes: VCs expected but input mesh contains no VCs" );
                }
                pVec2 += (*it)->mNumVertices;
            }
            ++n;
        }
    }

    if (out->mNumFaces) // just for safety
    {
        // copy faces
        out->mFaces = new aiFace[out->mNumFaces];
        aiFace* pf2 = out->mFaces;

        unsigned int ofs = 0;
        for (std::vector<aiMesh*>::const_iterator it = begin; it != end;++it)   {
            for (unsigned int m = 0; m < (*it)->mNumFaces;++m,++pf2)    {
                aiFace& face = (*it)->mFaces[m];
                pf2->mNumIndices = face.mNumIndices;
                pf2->mIndices = face.mIndices;

                if (ofs)    {
                    // add the offset to the vertex
                    for (unsigned int q = 0; q < face.mNumIndices; ++q)
                        face.mIndices[q] += ofs;
                }
                face.mIndices = NULL;
            }
            ofs += (*it)->mNumVertices;
        }
    }

    // bones - as this is quite lengthy, I moved the code to a separate function
    if (out->mNumBones)
        MergeBones(out,begin,end);

    // delete all source meshes
    for (std::vector<aiMesh*>::const_iterator it = begin; it != end;++it)
        delete *it;
}